

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestFailure.cpp
# Opt level: O2

void __thiscall
BinaryEqualFailure::BinaryEqualFailure
          (BinaryEqualFailure *this,UtestShell *test,char *fileName,size_t lineNumber,
          uchar *expected,uchar *actual,size_t size,SimpleString *text)

{
  SimpleString *this_00;
  long lVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  SimpleString *expected_00;
  
  TestFailure::TestFailure(&this->super_TestFailure,test,fileName,lineNumber);
  (this->super_TestFailure)._vptr_TestFailure = (_func_int **)&PTR__TestFailure_0015fd10;
  TestFailure::createUserText((TestFailure *)&stack0xffffffffffffffa0,(SimpleString *)test);
  this_00 = &(this->super_TestFailure).message_;
  SimpleString::operator=(this_00,(SimpleString *)&stack0xffffffffffffffa0);
  SimpleString::~SimpleString((SimpleString *)&stack0xffffffffffffffa0);
  StringFromBinaryOrNull(&stack0xffffffffffffffb0,(size_t)expected);
  expected_00 = (SimpleString *)actual;
  StringFromBinaryOrNull(&stack0xffffffffffffffc0,(size_t)actual);
  TestFailure::createButWasString
            ((TestFailure *)&stack0xffffffffffffffa0,expected_00,
             (SimpleString *)&stack0xffffffffffffffb0);
  SimpleString::operator+=(this_00,(SimpleString *)&stack0xffffffffffffffa0);
  SimpleString::~SimpleString((SimpleString *)&stack0xffffffffffffffa0);
  SimpleString::~SimpleString((SimpleString *)&stack0xffffffffffffffc0);
  SimpleString::~SimpleString((SimpleString *)&stack0xffffffffffffffb0);
  if (actual != (uchar *)0x0 && expected != (uchar *)0x0) {
    lVar3 = -1;
    do {
      lVar1 = lVar3 + 1;
      lVar4 = lVar3 + 1;
      lVar2 = lVar3 + 1;
      lVar3 = lVar4;
    } while (actual[lVar1] == expected[lVar2]);
    StringFromBinary(&stack0xffffffffffffffb0,(size_t)actual);
    TestFailure::createDifferenceAtPosString
              ((TestFailure *)&stack0xffffffffffffffa0,(SimpleString *)actual,
               (size_t)&stack0xffffffffffffffb0,(DifferenceFormat)lVar4);
    SimpleString::operator+=(this_00,(SimpleString *)&stack0xffffffffffffffa0);
    SimpleString::~SimpleString((SimpleString *)&stack0xffffffffffffffa0);
    SimpleString::~SimpleString((SimpleString *)&stack0xffffffffffffffb0);
  }
  return;
}

Assistant:

BinaryEqualFailure::BinaryEqualFailure(UtestShell* test, const char* fileName, size_t lineNumber, const unsigned char* expected,
                                       const unsigned char* actual, size_t size, const SimpleString& text)
: TestFailure(test, fileName, lineNumber)
{
    message_ = createUserText(text);

	message_ += createButWasString(StringFromBinaryOrNull(expected, size), StringFromBinaryOrNull(actual, size));
	if ((expected) && (actual))
	{
		size_t failStart;
		for (failStart = 0; actual[failStart] == expected[failStart]; failStart++)
			;
		message_ += createDifferenceAtPosString(StringFromBinary(actual, size), failStart, DIFFERENCE_BINARY);
	}
}